

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O0

void __thiscall Itemset::Itemset(Itemset *this,int it_sz,int ival_sz,int nclass,bool print)

{
  Array *pAVar1;
  value_type_conflict local_30 [4];
  byte local_1d;
  int local_1c;
  int iStack_18;
  bool print_local;
  int nclass_local;
  int ival_sz_local;
  int it_sz_local;
  Itemset *this_local;
  
  local_1d = print;
  local_1c = nclass;
  iStack_18 = ival_sz;
  nclass_local = it_sz;
  _ival_sz_local = this;
  std::shared_ptr<Array>::shared_ptr(&this->theItemset);
  std::shared_ptr<Array>::shared_ptr(&this->theIval);
  std::vector<int,_std::allocator<int>_>::vector(&this->clsSup);
  this->num_class = local_1c;
  this->do_print = (bool)(local_1d & 1);
  pAVar1 = (Array *)operator_new(0x18);
  Array::Array(pAVar1,nclass_local);
  std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::reset<Array>
            ((__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> *)this,pAVar1);
  pAVar1 = (Array *)operator_new(0x18);
  Array::Array(pAVar1,iStack_18);
  std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::reset<Array>
            (&(this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>,pAVar1);
  this->theSupport = 0;
  local_30[0] = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->clsSup,(long)this->num_class,local_30);
  return;
}

Assistant:

Itemset::Itemset(int it_sz, int ival_sz, int nclass, bool print) {
    num_class = nclass;
    do_print = print;
    theItemset.reset(new Array(it_sz));
    theIval.reset(new Array(ival_sz));
    theSupport = 0;
    clsSup.resize(num_class, 0);
}